

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::CaseStatementSyntax::getChild(CaseStatementSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  Token token_04;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff48;
  Info *in_stack_ffffffffffffff50;
  nullptr_t in_stack_ffffffffffffff58;
  ConstTokenOrSyntax *in_stack_ffffffffffffff60;
  
  switch(in_RDX) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    break;
  case 1:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    break;
  case 2:
    token.info = in_stack_ffffffffffffff50;
    token._0_8_ = in_stack_ffffffffffffff48;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4cfa96,token);
    break;
  case 3:
    token_00.info = in_stack_ffffffffffffff50;
    token_00._0_8_ = in_stack_ffffffffffffff48;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4cfad2,token_00);
    break;
  case 4:
    token_01.info = in_stack_ffffffffffffff50;
    token_01._0_8_ = in_stack_ffffffffffffff48;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4cfb0b,token_01);
    break;
  case 5:
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RSI + 0x88));
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    break;
  case 6:
    token_02.info = in_stack_ffffffffffffff50;
    token_02._0_8_ = in_stack_ffffffffffffff48;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4cfb64,token_02);
    break;
  case 7:
    token_03.info = in_stack_ffffffffffffff50;
    token_03._0_8_ = in_stack_ffffffffffffff48;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4cfb9a,token_03);
    break;
  case 8:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0xb0),in_stack_ffffffffffffff48);
    break;
  case 9:
    token_04.info = in_stack_ffffffffffffff50;
    token_04._0_8_ = in_stack_ffffffffffffff48;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4cfc0a,token_04);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax CaseStatementSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return uniqueOrPriority;
        case 3: return caseKeyword;
        case 4: return openParen;
        case 5: return expr.get();
        case 6: return closeParen;
        case 7: return matchesOrInside;
        case 8: return &items;
        case 9: return endcase;
        default: return nullptr;
    }
}